

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifySize.hpp
# Opt level: O3

void njoy::ENDFtk::section::CovariancePairs::verifySize(int NT,int NP)

{
  undefined8 *puVar1;
  
  if (NP * 2 == NT) {
    return;
  }
  tools::Log::error<char_const*>("Number of pairs inconsistent with vector size");
  tools::Log::info<char_const*,int>("NT value: {}",NT);
  tools::Log::info<char_const*,int>("NP value: {}",NP);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifySize( int NT, int NP ) {

  if ( NT != 2*NP ) {
    Log::error( "Number of pairs inconsistent with vector size" );
    Log::info( "NT value: {}", NT );
    Log::info( "NP value: {}", NP );
    throw std::exception();
  }

}